

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O0

void __thiscall
coro_io::multithread_context_pool::multithread_context_pool
          (multithread_context_pool *this,size_t thd_num)

{
  impl_type *in_RSI;
  io_context *in_RDI;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *unaff_retaddr;
  io_context *in_stack_ffffffffffffffa8;
  io_context *__args;
  io_context *in_stack_ffffffffffffffd0;
  promise<void> *this_00;
  basic_executor_type<std::allocator<void>,_0UL> local_28 [3];
  impl_type *local_10;
  io_context *executor;
  
  __args = in_RDI;
  local_10 = in_RSI;
  executor = in_RDI;
  asio::io_context::io_context(in_stack_ffffffffffffffd0);
  this_00 = (promise<void> *)(__args + 1);
  std::make_unique<asio::io_context::work,asio::io_context&>(__args);
  asio::io_context::get_executor(in_stack_ffffffffffffffa8);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(unaff_retaddr,(basic_executor_type<std::allocator<void>,_0UL> *)executor);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type(local_28);
  in_RDI[4].impl_ = local_10;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1c5853);
  std::promise<void>::promise(this_00);
  return;
}

Assistant:

multithread_context_pool(size_t thd_num = std::thread::hardware_concurrency())
      : work_(std::make_unique<asio::io_context::work>(ioc_)),
        executor_(ioc_.get_executor()),
        thd_num_(thd_num) {}